

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O3

pointer_type
cppcms::impl::
mfunc_to_event_handler<cppcms::impl::cgi::http_watchdog,std::shared_ptr<cppcms::impl::cgi::http_watchdog>>
          (offset_in_http_watchdog_to_subr f,shared_ptr<cppcms::impl::cgi::http_watchdog> *s)

{
  event_handler_binder_p0<void_(cppcms::impl::cgi::http_watchdog::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::cgi::http_watchdog>_>
  *this;
  shared_ptr<cppcms::impl::cgi::http_watchdog> *in_RCX;
  shared_ptr<cppcms::impl::cgi::http_watchdog> *local_30 [2];
  
  local_30[0] = s;
  this = (event_handler_binder_p0<void_(cppcms::impl::cgi::http_watchdog::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::cgi::http_watchdog>_>
          *)operator_new(0x30);
  event_handler_binder_p0<void_(cppcms::impl::cgi::http_watchdog::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::cgi::http_watchdog>_>
  ::event_handler_binder_p0(this,(offset_in_http_watchdog_to_subr *)local_30,in_RCX);
  *(event_handler_binder_p0<void_(cppcms::impl::cgi::http_watchdog::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::cgi::http_watchdog>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&)> *)f;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &e),S s)
{
	return new event_handler_binder_p0<void (C::*)(booster::system::error_code const &),S>(f,s);
}